

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::CheckboxFlags(char *label,uint *flags,uint flags_value)

{
  bool bVar1;
  bool local_1d;
  uint local_1c;
  bool pressed;
  bool v;
  uint *puStack_18;
  uint flags_value_local;
  uint *flags_local;
  char *label_local;
  
  local_1d = (*flags & flags_value) == flags_value;
  local_1c = flags_value;
  puStack_18 = flags;
  flags_local = (uint *)label;
  bVar1 = Checkbox(label,&local_1d);
  if (bVar1) {
    if ((local_1d & 1U) == 0) {
      *puStack_18 = (local_1c ^ 0xffffffff) & *puStack_18;
    }
    else {
      *puStack_18 = local_1c | *puStack_18;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::CheckboxFlags(const char* label, unsigned int* flags, unsigned int flags_value)
{
    bool v = ((*flags & flags_value) == flags_value);
    bool pressed = Checkbox(label, &v);
    if (pressed)
    {
        if (v)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }

    return pressed;
}